

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DExporter::Export_MetadataFloat
          (X3DExporter *this,aiString *pKey,float pValue,size_t pTabLevel)

{
  undefined1 *puVar1;
  _Node *p_Var2;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  allocator<char> local_85;
  float local_84;
  undefined1 local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_40;
  
  local_40._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_40;
  local_40._M_impl._M_node._M_size = 0;
  puVar1 = local_80 + 0x10;
  local_84 = pValue;
  local_80._0_8_ = puVar1;
  local_40._M_impl._M_node.super__List_node_base._M_prev =
       local_40._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"name","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_80 + 0x20),pKey->data,&local_85);
  p_Var2 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_40,(SAttribute *)local_80);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  local_40._M_impl._M_node._M_size = local_40._M_impl._M_node._M_size + 1;
  if (local_60._M_dataplus._M_p != local_80 + 0x30) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_80._0_8_ != puVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  local_80._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"value","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_80 + 0x20),
             vsnprintf,0x3a,"%f",(double)local_84);
  p_Var2 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_40,(SAttribute *)local_80);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  local_40._M_impl._M_node._M_size = local_40._M_impl._M_node._M_size + 1;
  if (local_60._M_dataplus._M_p != local_80 + 0x30) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_80._0_8_ != puVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  local_80._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MetadataFloat","");
  NodeHelper_OpenNode(this,(string *)local_80,pTabLevel,true,
                      (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_40);
  if ((undefined1 *)local_80._0_8_ != puVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_40);
  return;
}

Assistant:

void X3DExporter::Export_MetadataFloat(const aiString& pKey, const float pValue, const size_t pTabLevel)
{
list<SAttribute> attr_list;

	attr_list.push_back({"name", pKey.C_Str()});
	attr_list.push_back({"value", to_string(pValue)});
	NodeHelper_OpenNode("MetadataFloat", pTabLevel, true, attr_list);
}